

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O1

void __thiscall
cmCTestTestHandler::ExpandTestsToRunInformationForRerunFailed(cmCTestTestHandler *this)

{
  cmCTest *pcVar1;
  iterator __position;
  ulong uVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  long *plVar6;
  unsigned_long uVar7;
  char *pcVar8;
  ostream *poVar9;
  long lVar10;
  size_type *psVar11;
  long *plVar12;
  ulong __n;
  Directory directory;
  string lastTestsFailedLog;
  int val;
  string dirName;
  string logName;
  string pattern;
  string fileNameSubstring;
  ifstream ifs;
  uint local_470;
  Directory local_468;
  long *local_460;
  long local_458;
  long local_450;
  long lStack_448;
  int local_43c;
  string local_438;
  cmCTestTestHandler *local_418;
  string local_410;
  long *local_3f0;
  ulong local_3e8;
  long local_3e0 [2];
  long *local_3d0 [2];
  long local_3c0 [2];
  undefined1 local_3b0 [112];
  ios_base local_340 [264];
  undefined1 local_238 [32];
  byte abStack_218 [80];
  ios_base local_1c8 [408];
  
  cmCTest::GetBinaryDir_abi_cxx11_((string *)local_238,(this->super_cmCTestGenericHandler).CTest);
  plVar6 = (long *)std::__cxx11::string::append((char *)local_238);
  local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
  psVar11 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_438.field_2._M_allocated_capacity = *psVar11;
    local_438.field_2._8_8_ = plVar6[3];
  }
  else {
    local_438.field_2._M_allocated_capacity = *psVar11;
    local_438._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_438._M_string_length = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
    operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
  }
  cmsys::Directory::Directory(&local_468);
  bVar4 = cmsys::Directory::Load(&local_468,&local_438);
  if (bVar4) {
    uVar7 = cmsys::Directory::GetNumberOfFilesInDirectory(&local_438);
    local_3f0 = local_3e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"LastTestsFailed","");
    local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"");
    local_470 = (uint)uVar7;
    local_418 = this;
    if (0 < (int)local_470) {
      uVar7 = 0;
      do {
        pcVar8 = cmsys::Directory::GetFile(&local_468,uVar7);
        std::__cxx11::string::string((string *)local_238,pcVar8,(allocator *)local_3b0);
        std::__cxx11::string::substr((ulong)local_3b0,(ulong)local_238);
        uVar3 = local_3b0._8_8_;
        uVar2 = local_3e8;
        __n = local_3b0._8_8_;
        if (local_3e8 < (ulong)local_3b0._8_8_) {
          __n = local_3e8;
        }
        if (__n == 0) {
          bVar4 = true;
        }
        else {
          iVar5 = bcmp((void *)local_3b0._0_8_,local_3f0,__n);
          bVar4 = iVar5 == 0;
        }
        this = local_418;
        if ((bool)(bVar4 & uVar3 == uVar2)) {
          iVar5 = std::__cxx11::string::compare((char *)&local_410);
          if (iVar5 == 0) {
            std::__cxx11::string::_M_assign((string *)&local_410);
          }
          else {
            cmsys::SystemTools::FileTimeCompare(&local_410,(string *)local_238,(int *)&local_460);
            if ((int)local_460 == -1) {
              std::__cxx11::string::_M_assign((string *)&local_410);
            }
          }
        }
        if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
          operator_delete((void *)local_3b0._0_8_,CONCAT71(local_3b0._17_7_,local_3b0[0x10]) + 1);
        }
        if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
          operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
        }
        uVar7 = uVar7 + 1;
      } while ((local_470 & 0x7fffffff) != uVar7);
    }
    cmCTest::GetBinaryDir_abi_cxx11_((string *)local_3b0,(this->super_cmCTestGenericHandler).CTest);
    plVar6 = (long *)std::__cxx11::string::append(local_3b0);
    local_238._0_8_ = local_238 + 0x10;
    psVar11 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar11) {
      local_238._16_8_ = *psVar11;
      local_238._24_8_ = plVar6[3];
    }
    else {
      local_238._16_8_ = *psVar11;
      local_238._0_8_ = (size_type *)*plVar6;
    }
    local_238._8_8_ = plVar6[1];
    *plVar6 = (long)psVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append(local_238,(ulong)local_410._M_dataplus._M_p);
    local_460 = &local_450;
    plVar12 = plVar6 + 2;
    if ((long *)*plVar6 == plVar12) {
      local_450 = *plVar12;
      lStack_448 = plVar6[3];
    }
    else {
      local_450 = *plVar12;
      local_460 = (long *)*plVar6;
    }
    local_458 = plVar6[1];
    *plVar6 = (long)plVar12;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
      operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
    }
    pcVar8 = local_3b0 + 0x10;
    if ((char *)local_3b0._0_8_ != pcVar8) {
      operator_delete((void *)local_3b0._0_8_,CONCAT71(local_3b0._17_7_,local_3b0[0x10]) + 1);
    }
    bVar4 = cmsys::SystemTools::FileExists((char *)local_460);
    if (bVar4) {
      std::ifstream::ifstream(local_238,(char *)local_460,_S_in);
      if ((abStack_218[*(long *)(local_238._0_8_ + -0x18)] & 5) == 0) {
        local_3b0._8_8_ = 0;
        local_3b0[0x10] = '\0';
        local_3b0._0_8_ = pcVar8;
        while( true ) {
          bVar4 = cmsys::SystemTools::GetLineFromStream
                            ((istream *)local_238,(string *)local_3b0,(bool *)0x0,-1);
          if (!bVar4) break;
          lVar10 = std::__cxx11::string::find((char)(string *)local_3b0,0x3a);
          if (lVar10 != -1) {
            std::__cxx11::string::substr((ulong)local_3d0,(ulong)local_3b0);
            plVar6 = local_3d0[0];
            iVar5 = atoi((char *)local_3d0[0]);
            if (plVar6 != local_3c0) {
              operator_delete(plVar6,local_3c0[0] + 1);
            }
            __position._M_current =
                 (local_418->TestsToRun).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            local_43c = iVar5;
            if (__position._M_current ==
                (local_418->TestsToRun).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&this->TestsToRun,__position,&local_43c)
              ;
            }
            else {
              *__position._M_current = iVar5;
              (local_418->TestsToRun).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
          }
        }
        std::ifstream::close();
        if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
          operator_delete((void *)local_3b0._0_8_,CONCAT71(local_3b0._17_7_,local_3b0[0x10]) + 1);
        }
      }
      else {
        bVar4 = cmCTest::GetShowOnly((this->super_cmCTestGenericHandler).CTest);
        if ((!bVar4) && (((this->super_cmCTestGenericHandler).CTest)->PrintLabels == false)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3b0,"Problem reading file: ",0x16);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_3b0,(char *)local_460,local_458);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9," while generating list of previously failed tests.",0x32);
          std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                       ,0x71b,(char *)local_3d0[0],false);
          if (local_3d0[0] != local_3c0) {
            operator_delete(local_3d0[0],local_3c0[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
          std::ios_base::~ios_base(local_340);
        }
      }
      std::ifstream::~ifstream(local_238);
    }
    else {
      bVar4 = cmCTest::GetShowOnly((this->super_cmCTestGenericHandler).CTest);
      if ((!bVar4) && (((this->super_cmCTestGenericHandler).CTest)->PrintLabels == false)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_238,(char *)local_460,local_458);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," does not exist!",0x10);
        std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                     ,0x6ff,(char *)local_3b0._0_8_,false);
        if ((char *)local_3b0._0_8_ != pcVar8) {
          operator_delete((void *)local_3b0._0_8_,CONCAT71(local_3b0._17_7_,local_3b0[0x10]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
        std::ios_base::~ios_base(local_1c8);
      }
    }
    if (local_460 != &local_450) {
      operator_delete(local_460,local_450 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != &local_410.field_2) {
      operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
    }
    if (local_3f0 != local_3e0) {
      operator_delete(local_3f0,local_3e0[0] + 1);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_238,"Unable to read the contents of ",0x1f);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_238,local_438._M_dataplus._M_p,local_438._M_string_length);
    std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                 ,0x6d3,(char *)local_3b0._0_8_,false);
    if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
      operator_delete((void *)local_3b0._0_8_,CONCAT71(local_3b0._17_7_,local_3b0[0x10]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
    std::ios_base::~ios_base(local_1c8);
  }
  cmsys::Directory::~Directory(&local_468);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2) {
    operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCTestTestHandler::ExpandTestsToRunInformationForRerunFailed()
{

  std::string dirName = this->CTest->GetBinaryDir() + "/Testing/Temporary";

  cmsys::Directory directory;
  if (directory.Load(dirName) == 0)
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Unable to read the contents of "
      << dirName << std::endl);
    return;
    }

  int numFiles = static_cast<int>
    (cmsys::Directory::GetNumberOfFilesInDirectory(dirName));
  std::string pattern = "LastTestsFailed";
  std::string logName = "";

  for (int i = 0; i < numFiles; ++i)
    {
    std::string fileName = directory.GetFile(i);
    // bcc crashes if we attempt a normal substring comparison,
    // hence the following workaround
    std::string fileNameSubstring = fileName.substr(0, pattern.length());
    if (fileNameSubstring.compare(pattern) != 0)
      {
      continue;
      }
    if (logName == "")
      {
      logName = fileName;
      }
    else
      {
      // if multiple matching logs were found we use the most recently
      // modified one.
      int res;
      cmSystemTools::FileTimeCompare(logName, fileName, &res);
      if (res == -1)
        {
        logName = fileName;
        }
      }
    }

  std::string lastTestsFailedLog = this->CTest->GetBinaryDir()
    + "/Testing/Temporary/" + logName;

  if ( !cmSystemTools::FileExists(lastTestsFailedLog.c_str()) )
    {
    if ( !this->CTest->GetShowOnly() && !this->CTest->ShouldPrintLabels() )
      {
      cmCTestLog(this->CTest, ERROR_MESSAGE, lastTestsFailedLog
        << " does not exist!" << std::endl);
      }
    return;
    }

  // parse the list of tests to rerun from LastTestsFailed.log
  cmsys::ifstream ifs(lastTestsFailedLog.c_str());
  if ( ifs )
    {
    std::string line;
    std::string::size_type pos;
    while ( cmSystemTools::GetLineFromStream(ifs, line) )
      {
      pos = line.find(':', 0);
      if (pos == line.npos)
        {
        continue;
        }

      int val = atoi(line.substr(0, pos).c_str());
      this->TestsToRun.push_back(val);
      }
    ifs.close();
    }
  else if ( !this->CTest->GetShowOnly() && !this->CTest->ShouldPrintLabels() )
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Problem reading file: "
      << lastTestsFailedLog <<
      " while generating list of previously failed tests." << std::endl);
    }
}